

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.cpp
# Opt level: O2

Result<void> * kernel::SanityChecks(Result<void> *__return_storage_ptr__,Context *param_1)

{
  bool bVar1;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff78;
  bilingual_str local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = Random_SanityCheck();
  if (bVar1) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff88,
               "OS cryptographic RNG sanity check failure. Aborting.",
               (allocator<char> *)&stack0xffffffffffffff87);
    Untranslated(&local_58,in_stack_ffffffffffffff78);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_58);
    bilingual_str::~bilingual_str(&local_58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> SanityChecks(const Context&)
{
    if (!Random_SanityCheck()) {
        return util::Error{Untranslated("OS cryptographic RNG sanity check failure. Aborting.")};
    }

    return {};
}